

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsKeyDown(ImGuiKey key,ImGuiID owner_id)

{
  bool bVar1;
  ImGuiKeyData *pIVar2;
  
  pIVar2 = GetKeyData(key);
  if (pIVar2->Down == true) {
    bVar1 = TestKeyOwner(key,owner_id);
    return bVar1;
  }
  return false;
}

Assistant:

bool ImGui::IsKeyDown(ImGuiKey key, ImGuiID owner_id)
{
    const ImGuiKeyData* key_data = GetKeyData(key);
    if (!key_data->Down)
        return false;
    if (!TestKeyOwner(key, owner_id))
        return false;
    return true;
}